

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolInfo.cpp
# Opt level: O2

void __thiscall
MethodInfo::MethodInfo
          (MethodInfo *this,string *_name,bool _isPublic,shared_ptr<TypeInfo> *_returnType)

{
  std::__cxx11::string::string((string *)this,(string *)_name);
  this->isPublic = _isPublic;
  std::__shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->returnType).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>,
             &_returnType->super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>);
  (this->fields).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->fields).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->arguments).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->arguments).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

MethodInfo::MethodInfo( const std::string & _name, bool _isPublic, std::shared_ptr<TypeInfo> _returnType )
	:name( _name ), isPublic( _isPublic ), returnType( _returnType )
{}